

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void heightOfSelect(Select *pSelect,int *pnHeight)

{
  int iVar1;
  
  for (; pSelect != (Select *)0x0; pSelect = pSelect->pPrior) {
    if ((pSelect->pWhere != (Expr *)0x0) && (iVar1 = pSelect->pWhere->nHeight, *pnHeight < iVar1)) {
      *pnHeight = iVar1;
    }
    if ((pSelect->pHaving != (Expr *)0x0) && (iVar1 = pSelect->pHaving->nHeight, *pnHeight < iVar1))
    {
      *pnHeight = iVar1;
    }
    if ((pSelect->pLimit != (Expr *)0x0) && (iVar1 = pSelect->pLimit->nHeight, *pnHeight < iVar1)) {
      *pnHeight = iVar1;
    }
    heightOfExprList(pSelect->pEList,pnHeight);
    heightOfExprList(pSelect->pGroupBy,pnHeight);
    heightOfExprList(pSelect->pOrderBy,pnHeight);
  }
  return;
}

Assistant:

static void heightOfSelect(Select *pSelect, int *pnHeight){
  Select *p;
  for(p=pSelect; p; p=p->pPrior){
    heightOfExpr(p->pWhere, pnHeight);
    heightOfExpr(p->pHaving, pnHeight);
    heightOfExpr(p->pLimit, pnHeight);
    heightOfExprList(p->pEList, pnHeight);
    heightOfExprList(p->pGroupBy, pnHeight);
    heightOfExprList(p->pOrderBy, pnHeight);
  }
}